

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::Coap::RequestHolder::RequestHolder
          (RequestHolder *this,RequestPtr *aRequest,ResponseHandler *aHandler)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint32_t uVar2;
  long lVar3;
  
  (this->mRequest).super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (aRequest->
           super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (aRequest->
           super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->mRequest).super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
            (&this->mHandler,aHandler);
  this->mRetransmissionCount = 0;
  (this->mNextTimerShot).__d.__r = 0;
  this->mAcknowledged = false;
  uVar2 = random::non_crypto::GetUint32();
  (this->mRetransmissionDelay).__r = (ulong)(uVar2 % 1000 + 2000);
  lVar3 = std::chrono::_V2::system_clock::now();
  (this->mNextTimerShot).__d.__r = (this->mRetransmissionDelay).__r * 1000000 + lVar3;
  return;
}

Assistant:

Coap::RequestHolder::RequestHolder(const RequestPtr &aRequest, ResponseHandler aHandler)
    : mRequest(aRequest)
    , mHandler(aHandler)
    , mRetransmissionCount(0)
    , mAcknowledged(false)
{
    uint32_t lowBound    = 1000 * kAckTimeout;
    uint32_t upperBound  = 1000 * kAckTimeout * kAckRandomFactorNumerator / kAckRandomFactorDenominator;
    uint32_t delay       = random::non_crypto::GetUint32InRange(lowBound, upperBound);
    mRetransmissionDelay = std::chrono::milliseconds(delay);
    mNextTimerShot       = Clock::now() + mRetransmissionDelay;
}